

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  fpclass_type fVar1;
  int32_t iVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxId *pSVar6;
  int32_t iVar8;
  undefined8 uVar7;
  int32_t iVar9;
  int iVar10;
  int iVar11;
  undefined8 *puVar12;
  long lVar13;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar14;
  int32_t *piVar15;
  fpclass_type fVar16;
  int *piVar17;
  int *piVar18;
  cpp_dec_float<200u,int,void> *pcVar19;
  pointer pnVar20;
  uint *puVar21;
  pointer pnVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  uint *puVar24;
  cpp_dec_float<200u,int,void> *pcVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar26;
  undefined8 *puVar27;
  undefined4 *puVar28;
  undefined4 *puVar29;
  cpp_dec_float<200U,_int,_void> *pcVar30;
  uint *puVar31;
  cpp_dec_float<200U,_int,_void> *pcVar32;
  undefined4 *puVar33;
  byte bVar34;
  int32_t iVar35;
  long lVar36;
  long lVar37;
  cpp_dec_float<200u,int,void> *this_00;
  long in_FS_OFFSET;
  byte bVar38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [13];
  undefined3 uStack_47b;
  int iStack_478;
  bool bStack_474;
  undefined8 local_470;
  int local_45c;
  int *local_458;
  cpp_dec_float<200u,int,void> *local_450;
  cpp_dec_float<200U,_int,_void> *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  undefined1 local_438 [32];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [13];
  undefined3 uStack_3cb;
  int iStack_3c8;
  bool bStack_3c4;
  undefined8 local_3c0;
  pointer local_3b8;
  Type local_3ac;
  undefined1 local_3a8 [32];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [13];
  undefined3 uStack_33b;
  int iStack_338;
  bool bStack_334;
  undefined8 local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  fpclass_type *local_320;
  fpclass_type *local_318;
  undefined8 local_310;
  undefined1 local_308 [32];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [13];
  undefined3 uStack_29b;
  int iStack_298;
  bool bStack_294;
  undefined8 local_290;
  cpp_dec_float<200U,_int,_void> local_280;
  pointer local_200;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar38 = 0;
  local_3c0._0_4_ = cpp_dec_float_finite;
  local_3c0._4_4_ = 0x1c;
  local_438._0_16_ = (undefined1  [16])0x0;
  local_438._16_16_ = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_3cb = 0;
  iStack_3c8 = 0;
  bStack_3c4 = false;
  local_290._0_4_ = cpp_dec_float_finite;
  local_290._4_4_ = 0x1c;
  local_308._0_16_ = (undefined1  [16])0x0;
  local_308._16_16_ = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_29b = 0;
  iStack_298 = 0;
  bStack_294 = false;
  local_c0._0_4_ = cpp_dec_float_finite;
  local_c0._4_4_ = 0x1c;
  local_138._0_16_ = (undefined1  [16])0x0;
  local_138._16_16_ = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_cb = 0;
  iStack_c8 = 0;
  bStack_c4 = false;
  local_140._0_4_ = cpp_dec_float_finite;
  local_140._4_4_ = 0x1c;
  local_1b8._0_16_ = (undefined1  [16])0x0;
  local_1b8._16_16_ = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = SUB1613((undefined1  [16])0x0,0);
  local_310 = 0;
  uStack_14b = 0;
  iStack_148 = 0;
  bStack_144 = false;
  local_3ac = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_3ac != LEAVE) {
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_310 = CONCAT71((int7)((ulong)pSVar5 >> 8),pSVar5->theRep == ROW);
  }
  puVar24 = (uint *)maxabs;
  pcVar30 = &local_280;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar30->data)._M_elems[0] = *puVar24;
    puVar24 = puVar24 + 1;
    pcVar30 = (cpp_dec_float<200U,_int,_void> *)((pcVar30->data)._M_elems + 1);
  }
  local_280.exp = (maxabs->m_backend).exp;
  local_280.neg = (maxabs->m_backend).neg;
  local_1c0 = maxabs;
  local_280.fpclass = (maxabs->m_backend).fpclass;
  local_280.prec_elem = (maxabs->m_backend).prec_elem;
  local_318 = (fpclass_type *)
              (upBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_320 = (fpclass_type *)
              (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3b8 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar17 = (update->thedelta).super_IdxSet.idx;
  local_200 = (update->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puVar24 = (uint *)val;
  pcVar30 = &local_b0;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar30->data)._M_elems[0] = *puVar24;
    puVar24 = puVar24 + 1;
    pcVar30 = (cpp_dec_float<200U,_int,_void> *)((pcVar30->data)._M_elems + 1);
  }
  local_b0.exp = (val->m_backend).exp;
  local_b0.neg = (val->m_backend).neg;
  local_b0.fpclass = (val->m_backend).fpclass;
  local_b0.prec_elem = (val->m_backend).prec_elem;
  local_1c8 = val;
  if ((update->thedelta).setupStatus == true) {
    iVar11 = (update->thedelta).super_IdxSet.num;
    local_45c = -1;
    if (start < iVar11) {
      local_440 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(piVar17 + iVar11);
      piVar17 = piVar17 + start;
      local_328 = &this->epsilon;
      local_1e8 = *(double *)(in_FS_OFFSET + -8);
      uStack_1e0 = 0;
      local_1f8 = -*(double *)(in_FS_OFFSET + -8);
      uStack_1f0 = 0x8000000000000000;
      local_450 = (cpp_dec_float<200u,int,void> *)((long)incr << 2);
      local_45c = -1;
      local_448 = &(this->fastDelta).m_backend;
      do {
        iVar11 = *piVar17;
        if (local_3ac == LEAVE) {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (this->iscoid == true) {
            pDVar14 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar14 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (pSVar5->theRep * pDVar14->data[iVar11] < 1) goto LAB_005bb4fc;
          goto LAB_005bbba0;
        }
LAB_005bb4fc:
        if ((char)local_310 != '\0') {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar6[iVar11].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)local_4e8,pSVar6 + iVar11);
            iVar10 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_4e8);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar10] == P_FIXED) goto LAB_005bbba0;
          }
        }
        pnVar22 = local_200;
        pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
        pnVar20 = local_200 + iVar11;
        pcVar23 = pcVar30;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar23->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar38 * -2 + 1) * 4);
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar38 * -8 + 4);
        }
        iStack_3c8 = pnVar22[iVar11].m_backend.exp;
        bStack_3c4 = pnVar22[iVar11].m_backend.neg;
        fVar3 = pnVar22[iVar11].m_backend.fpclass;
        iVar8 = pnVar22[iVar11].m_backend.prec_elem;
        local_3c0._0_4_ = fVar3;
        local_3c0._4_4_ = iVar8;
        pnVar26 = local_328;
        puVar24 = (uint *)local_4e8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar24 = (pnVar26->m_backend).data._M_elems[0];
          pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar26 + (ulong)bVar38 * -8 + 4);
          puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
        }
        iStack_478 = (this->epsilon).m_backend.exp;
        bStack_474 = (this->epsilon).m_backend.neg;
        fVar16 = (this->epsilon).m_backend.fpclass;
        iVar35 = (this->epsilon).m_backend.prec_elem;
        local_470._0_4_ = (this->epsilon).m_backend.fpclass;
        local_470._4_4_ = (this->epsilon).m_backend.prec_elem;
        puVar24 = local_280.data._M_elems + 1;
        if (fVar16 == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) {
LAB_005bb6a8:
          pnVar26 = local_328;
          puVar21 = (uint *)local_4e8;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pnVar26->m_backend).data._M_elems[0];
            pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar26 + (ulong)bVar38 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar38 * -2 + 1;
          }
          local_470._4_4_ = iVar35;
          local_470._0_4_ = fVar16;
          if (local_4e8._0_4_ != 0 || fVar16 != cpp_dec_float_finite) {
            bStack_474 = (bool)(bStack_474 ^ 1);
          }
          if ((fVar16 != cpp_dec_float_NaN) && ((fpclass_type)local_3c0 != cpp_dec_float_NaN)) {
            local_458 = (int *)CONCAT44(local_458._4_4_,iVar11);
            iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar30,(cpp_dec_float<200U,_int,_void> *)local_4e8);
            if (iVar10 < 0) {
              puVar21 = (uint *)local_4e8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar21 = (pcVar30->data)._M_elems[0];
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar38 * -8 + 4)
                ;
                puVar21 = puVar21 + (ulong)bVar38 * -2 + 1;
              }
              iStack_478 = iStack_3c8;
              bStack_474 = bStack_3c4;
              local_470._0_4_ = (fpclass_type)local_3c0;
              local_470._4_4_ = local_3c0._4_4_;
              if (local_4e8._0_4_ != 0 || (fpclass_type)local_3c0 != cpp_dec_float_finite) {
                bStack_474 = (bool)(bStack_3c4 ^ 1);
              }
              fVar16 = local_280.fpclass;
              if (local_280.fpclass == cpp_dec_float_NaN ||
                  (fpclass_type)local_3c0 == cpp_dec_float_NaN) {
LAB_005bb976:
                puVar21 = puVar24;
                puVar31 = (uint *)local_3a8;
                for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
                  *puVar31 = *puVar21;
                  puVar21 = puVar21 + (ulong)bVar38 * -2 + 1;
                  puVar31 = puVar31 + (ulong)bVar38 * -2 + 1;
                }
                iVar10 = local_280.exp;
                bVar34 = local_280.neg;
                iVar35 = local_280.prec_elem;
              }
              else {
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_4e8,&local_280);
                if (iVar10 < 1) {
                  fVar16 = local_280.fpclass;
                  goto LAB_005bb976;
                }
                puVar29 = (undefined4 *)(local_438 + 4);
                puVar28 = (undefined4 *)local_3a8;
                for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
                  *puVar28 = *puVar29;
                  puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
                  puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
                }
                local_280.data._M_elems[0] = 0;
                iVar10 = iStack_3c8;
                iVar35 = local_3c0._4_4_;
                if ((fpclass_type)local_3c0 == cpp_dec_float_finite && local_438._0_4_ == 0) {
                  fVar16 = cpp_dec_float_finite;
                  bVar34 = bStack_3c4;
                }
                else {
                  bVar34 = bStack_3c4 ^ 1;
                  fVar16 = (fpclass_type)local_3c0;
                  local_280.data._M_elems[0] = local_438._0_4_;
                }
              }
              puVar21 = (uint *)local_3a8;
              for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar24 = *puVar21;
                puVar21 = puVar21 + (ulong)bVar38 * -2 + 1;
                puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
              }
              local_280.prec_elem = iVar35;
              local_280.fpclass = fVar16;
              pnVar22 = (pointer)((long)local_320 + (long)iVar11 * 0x80);
              puVar29 = (undefined4 *)local_1b8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar29 = (pnVar22->m_backend).data._M_elems[0];
                pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar38 * -2 + 1) * 4);
                puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
              }
              iStack_148 = (((pointer)((long)local_320 + (long)iVar11 * 0x80))->m_backend).exp;
              bStack_144 = (((pointer)((long)local_320 + (long)iVar11 * 0x80))->m_backend).neg;
              local_140._0_4_ =
                   (((pointer)((long)local_320 + (long)iVar11 * 0x80))->m_backend).fpclass;
              local_140._4_4_ =
                   (((pointer)((long)local_320 + (long)iVar11 * 0x80))->m_backend).prec_elem;
              local_280.exp = iVar10;
              local_280.neg = (bool)bVar34;
              ::soplex::infinity::__tls_init();
              local_470._0_4_ = cpp_dec_float_finite;
              local_470._4_4_ = 0x1c;
              local_4e8._0_16_ = (undefined1  [16])0x0;
              local_4e8._16_16_ = (undefined1  [16])0x0;
              local_4c8 = (undefined1  [16])0x0;
              local_4b8 = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_488 = SUB1613((undefined1  [16])0x0,0);
              uStack_47b = 0;
              iStack_478 = 0;
              bStack_474 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_4e8,local_1f8);
              if ((((fpclass_type)local_140 != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_470 != cpp_dec_float_NaN)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_1b8,
                                      (cpp_dec_float<200U,_int,_void> *)local_4e8), 0 < iVar10)) {
                pcVar30 = &local_3b8[iVar11].m_backend;
                local_470._0_4_ = cpp_dec_float_finite;
                local_470._4_4_ = 0x1c;
                local_4e8._0_16_ = (undefined1  [16])0x0;
                local_4e8._16_16_ = (undefined1  [16])0x0;
                local_4c8 = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = SUB1613((undefined1  [16])0x0,0);
                uStack_47b = 0;
                iStack_478 = 0;
                bStack_474 = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_4e8 == pcVar30) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                             (cpp_dec_float<200U,_int,_void> *)local_1b8);
                  if (local_4e8._0_4_ == 0 && (fpclass_type)local_470 == cpp_dec_float_finite) {
                    local_290._0_4_ = cpp_dec_float_finite;
                  }
                  else {
                    bStack_474 = (bool)(bStack_474 ^ 1);
                    local_290._0_4_ = (fpclass_type)local_470;
                  }
                }
                else {
                  puVar29 = (undefined4 *)local_1b8;
                  puVar28 = (undefined4 *)local_4e8;
                  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                    *puVar28 = *puVar29;
                    puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
                    puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
                  }
                  iStack_478 = iStack_148;
                  bStack_474 = bStack_144;
                  local_470._0_4_ = (fpclass_type)local_140;
                  local_470._4_4_ = local_140._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4e8,pcVar30);
                  local_290._0_4_ = (fpclass_type)local_470;
                }
                puVar29 = (undefined4 *)local_4e8;
                puVar28 = (undefined4 *)local_308;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  *puVar28 = *puVar29;
                  puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
                  puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
                }
                iStack_298 = iStack_478;
                bStack_294 = bStack_474;
                local_290._4_4_ = local_470._4_4_;
                if ((fpclass_type)local_290 == cpp_dec_float_NaN) {
LAB_005bbf95:
                  local_330._0_4_ = cpp_dec_float_finite;
                  local_330._4_4_ = 0x1c;
                  local_3a8._0_16_ = (undefined1  [16])0x0;
                  local_3a8._16_16_ = (undefined1  [16])0x0;
                  local_388 = (undefined1  [16])0x0;
                  local_378 = (undefined1  [16])0x0;
                  local_368 = (undefined1  [16])0x0;
                  local_358 = (undefined1  [16])0x0;
                  local_348 = SUB1613((undefined1  [16])0x0,0);
                  uStack_33b = 0;
                  iStack_338 = 0;
                  bStack_334 = false;
                  if ((cpp_dec_float<200U,_int,_void> *)local_3a8 == local_448) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_3a8,
                               (cpp_dec_float<200U,_int,_void> *)local_308);
                    if (local_3a8._0_4_ != 0 || (fpclass_type)local_330 != cpp_dec_float_finite) {
                      bStack_334 = (bool)(bStack_334 ^ 1);
                    }
                  }
                  else {
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_308;
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_3a8;
                    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                      (pcVar23->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                      pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar30 + (ulong)bVar38 * -8 + 4);
                      pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar23 + (ulong)bVar38 * -8 + 4);
                    }
                    iStack_338 = iStack_298;
                    bStack_334 = bStack_294;
                    local_330._0_4_ = (fpclass_type)local_290;
                    local_330._4_4_ = local_290._4_4_;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_3a8,local_448);
                  }
                  local_470._0_4_ = cpp_dec_float_finite;
                  local_470._4_4_ = 0x1c;
                  local_4e8._0_16_ = (undefined1  [16])0x0;
                  local_4e8._16_16_ = (undefined1  [16])0x0;
                  local_4c8 = (undefined1  [16])0x0;
                  local_4b8 = (undefined1  [16])0x0;
                  local_4a8 = (undefined1  [16])0x0;
                  local_498 = (undefined1  [16])0x0;
                  local_488 = SUB1613((undefined1  [16])0x0,0);
                  uStack_47b = 0;
                  iStack_478 = 0;
                  bStack_474 = false;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                             (cpp_dec_float<200U,_int,_void> *)local_3a8,
                             (cpp_dec_float<200U,_int,_void> *)local_438);
                  puVar24 = (uint *)local_4e8;
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
                  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                    (pcVar30->data)._M_elems[0] = *puVar24;
                    puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar38 * -8 + 4);
                  }
                  iStack_3c8 = iStack_478;
                  bStack_3c4 = bStack_474;
                  local_3c0._0_4_ = (fpclass_type)local_470;
                  local_3c0._4_4_ = local_470._4_4_;
                  iVar11 = (int)local_458;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            ((cpp_dec_float<200U,_int,_void> *)local_4e8,0,(type *)0x0);
                  iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_308,
                                      (cpp_dec_float<200U,_int,_void> *)local_4e8);
                  if (iVar11 < 0) goto LAB_005bbf95;
                  pcVar30 = local_448;
                  puVar24 = (uint *)local_3a8;
                  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                    *puVar24 = (pcVar30->data)._M_elems[0];
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar38 * -8 + 4);
                    puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
                  }
                  iStack_338 = (this->fastDelta).m_backend.exp;
                  bStack_334 = (this->fastDelta).m_backend.neg;
                  local_330._0_4_ = (this->fastDelta).m_backend.fpclass;
                  local_330._4_4_ = (this->fastDelta).m_backend.prec_elem;
                  iVar11 = (int)local_458;
                  if ((fpclass_type)local_330 != cpp_dec_float_finite || local_3a8._0_4_ != 0) {
                    bStack_334 = (bool)(bStack_334 ^ 1);
                  }
                  local_470._0_4_ = cpp_dec_float_finite;
                  local_470._4_4_ = 0x1c;
                  local_4e8._0_16_ = (undefined1  [16])0x0;
                  local_4e8._16_16_ = (undefined1  [16])0x0;
                  local_4c8 = (undefined1  [16])0x0;
                  local_4b8 = (undefined1  [16])0x0;
                  local_4a8 = (undefined1  [16])0x0;
                  local_498 = (undefined1  [16])0x0;
                  local_488 = SUB1613((undefined1  [16])0x0,0);
                  uStack_47b = 0;
                  iStack_478 = 0;
                  bStack_474 = false;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                             (cpp_dec_float<200U,_int,_void> *)local_3a8,
                             (cpp_dec_float<200U,_int,_void> *)local_438);
                  puVar24 = (uint *)local_4e8;
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
                  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                    (pcVar30->data)._M_elems[0] = *puVar24;
                    puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar38 * -8 + 4);
                  }
                  iStack_3c8 = iStack_478;
                  bStack_3c4 = bStack_474;
                  local_3c0._0_4_ = (fpclass_type)local_470;
                  local_3c0._4_4_ = local_470._4_4_;
                }
                iStack_3c8 = iStack_478;
                bStack_3c4 = bStack_474;
                local_3c0 = local_470;
                if (((fpclass_type)local_470 != cpp_dec_float_NaN) &&
                   (local_b0.fpclass != cpp_dec_float_NaN)) goto LAB_005bc11c;
              }
            }
          }
        }
        else {
          iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar30,(cpp_dec_float<200U,_int,_void> *)local_4e8);
          if (iVar10 < 1) {
            iStack_478 = (this->epsilon).m_backend.exp;
            bStack_474 = (this->epsilon).m_backend.neg;
            fVar16 = (this->epsilon).m_backend.fpclass;
            iVar35 = (this->epsilon).m_backend.prec_elem;
            goto LAB_005bb6a8;
          }
          piVar15 = &local_280.prec_elem;
          fVar16 = local_280.fpclass;
          if (local_280.fpclass != cpp_dec_float_NaN && (fpclass_type)local_3c0 != cpp_dec_float_NaN
             ) {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar30,&local_280);
            if (iVar10 < 1) {
              piVar15 = &local_280.prec_elem;
              fVar16 = local_280.fpclass;
            }
            else {
              pcVar23 = pcVar30;
              pcVar32 = &local_280;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar32->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar38 * -8 + 4)
                ;
                pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar38 * -8 + 4)
                ;
              }
              local_280.exp = iStack_3c8;
              local_280.neg = bStack_3c4;
              piVar15 = (int32_t *)((long)&local_3c0 + 4);
              fVar16 = (fpclass_type)local_3c0;
            }
          }
          local_280.fpclass = fVar16;
          local_280.prec_elem = *piVar15;
          pnVar22 = (pointer)((long)local_318 + (long)iVar11 * 0x80);
          puVar29 = (undefined4 *)local_138;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar29 = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar38 * -2 + 1) * 4);
            puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
          }
          iStack_c8 = (((pointer)((long)local_318 + (long)iVar11 * 0x80))->m_backend).exp;
          bStack_c4 = (((pointer)((long)local_318 + (long)iVar11 * 0x80))->m_backend).neg;
          local_c0._0_4_ = (((pointer)((long)local_318 + (long)iVar11 * 0x80))->m_backend).fpclass;
          local_c0._4_4_ = (((pointer)((long)local_318 + (long)iVar11 * 0x80))->m_backend).prec_elem
          ;
          ::soplex::infinity::__tls_init();
          local_470._0_4_ = cpp_dec_float_finite;
          local_470._4_4_ = 0x1c;
          local_4e8._0_16_ = (undefined1  [16])0x0;
          local_4e8._16_16_ = (undefined1  [16])0x0;
          local_4c8 = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = SUB1613((undefined1  [16])0x0,0);
          uStack_47b = 0;
          iStack_478 = 0;
          bStack_474 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4e8,local_1e8);
          if ((((fpclass_type)local_c0 == cpp_dec_float_NaN) ||
              ((fpclass_type)local_470 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_138,
                                  (cpp_dec_float<200U,_int,_void> *)local_4e8), -1 < iVar10))
          goto LAB_005bbba0;
          pcVar23 = &local_3b8[iVar11].m_backend;
          local_470._0_4_ = cpp_dec_float_finite;
          local_470._4_4_ = 0x1c;
          local_4e8._0_16_ = (undefined1  [16])0x0;
          local_4e8._16_16_ = (undefined1  [16])0x0;
          local_4c8 = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = SUB1613((undefined1  [16])0x0,0);
          uStack_47b = 0;
          iStack_478 = 0;
          bStack_474 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_4e8 == pcVar23) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                       (cpp_dec_float<200U,_int,_void> *)local_138);
            if (local_4e8._0_4_ == 0 && (fpclass_type)local_470 == cpp_dec_float_finite) {
              local_290._0_4_ = cpp_dec_float_finite;
            }
            else {
              bStack_474 = (bool)(bStack_474 ^ 1);
              local_290._0_4_ = (fpclass_type)local_470;
            }
          }
          else {
            puVar29 = (undefined4 *)local_138;
            puVar28 = (undefined4 *)local_4e8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar28 = *puVar29;
              puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
              puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
            }
            iStack_478 = iStack_c8;
            bStack_474 = bStack_c4;
            local_470._0_4_ = (fpclass_type)local_c0;
            local_470._4_4_ = local_c0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_4e8,pcVar23);
            local_290._0_4_ = (fpclass_type)local_470;
          }
          puVar29 = (undefined4 *)local_4e8;
          puVar28 = (undefined4 *)local_308;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar28 = *puVar29;
            puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
            puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
          }
          iStack_298 = iStack_478;
          bStack_294 = bStack_474;
          local_290._4_4_ = local_470._4_4_;
          if ((fpclass_type)local_290 == cpp_dec_float_NaN) {
LAB_005bbc5c:
            local_330._0_4_ = cpp_dec_float_finite;
            local_330._4_4_ = 0x1c;
            local_3a8._0_16_ = (undefined1  [16])0x0;
            local_3a8._16_16_ = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = (undefined1  [16])0x0;
            local_348 = SUB1613((undefined1  [16])0x0,0);
            uStack_33b = 0;
            iStack_338 = 0;
            bStack_334 = false;
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_308;
            if ((cpp_dec_float<200U,_int,_void> *)local_3a8 != local_448) {
              pcVar32 = (cpp_dec_float<200U,_int,_void> *)local_3a8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar32->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar38 * -8 + 4)
                ;
                pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar38 * -8 + 4)
                ;
              }
              iStack_338 = iStack_298;
              bStack_334 = bStack_294;
              local_330._0_4_ = (fpclass_type)local_290;
              local_330._4_4_ = local_290._4_4_;
              pcVar23 = local_448;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_3a8,pcVar23);
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            uStack_47b = 0;
            iStack_478 = 0;
            bStack_474 = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                       (cpp_dec_float<200U,_int,_void> *)local_3a8,pcVar30);
            lVar13 = 0x1c;
            puVar24 = (uint *)local_4e8;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4e8,0,(type *)0x0);
            iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_308,
                                (cpp_dec_float<200U,_int,_void> *)local_4e8);
            if (0 < iVar10) goto LAB_005bbc5c;
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            uStack_47b = 0;
            iStack_478 = 0;
            bStack_474 = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_4e8,local_448,pcVar30);
            lVar13 = 0x1c;
            puVar24 = (uint *)local_4e8;
          }
          for (; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar30->data)._M_elems[0] = *puVar24;
            puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar38 * -8 + 4);
          }
          iStack_3c8 = iStack_478;
          bStack_3c4 = bStack_474;
          local_3c0._0_4_ = (fpclass_type)local_470;
          local_3c0._4_4_ = local_470._4_4_;
          if (((fpclass_type)local_470 == cpp_dec_float_NaN) ||
             (local_b0.fpclass == cpp_dec_float_NaN)) goto LAB_005bbba0;
LAB_005bc11c:
          iStack_478 = iStack_3c8;
          bStack_474 = bStack_3c4;
          local_470 = local_3c0;
          iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_438,&local_b0);
          if (iVar10 < 0) {
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
            pcVar23 = &local_b0;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar38 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar23 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_b0.exp = iStack_3c8;
            local_b0.neg = bStack_3c4;
            local_b0.fpclass = (fpclass_type)local_3c0;
            local_b0.prec_elem = local_3c0._4_4_;
            local_45c = iVar11;
          }
        }
LAB_005bbba0:
        piVar17 = (int *)((long)piVar17 + (long)local_450);
      } while (piVar17 < local_440);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    lVar13 = (long)(int)((ulong)((long)(update->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_3b8)
                        >> 7);
    if (lVar13 < 1) {
      local_45c = -1;
      piVar18 = piVar17;
      local_1d0 = update;
    }
    else {
      local_1d0 = update;
      local_440 = &this->epsilon;
      local_448 = &(this->fastDelta).m_backend;
      local_1e8 = *(double *)(in_FS_OFFSET + -8);
      uStack_1e0 = 0;
      local_1f8 = -*(double *)(in_FS_OFFSET + -8);
      uStack_1f0 = 0x8000000000000000;
      local_318 = &(((pointer)local_318)->m_backend).fpclass;
      local_320 = &(((pointer)local_320)->m_backend).fpclass;
      local_45c = -1;
      lVar36 = 0;
      lVar37 = 0;
      pcVar19 = (cpp_dec_float<200u,int,void> *)0x0;
      local_328 = local_200 + lVar13;
      do {
        pnVar22 = local_200;
        this_00 = (cpp_dec_float<200u,int,void> *)((long)&(local_200->m_backend).data + lVar37);
        pcVar25 = this_00;
        puVar29 = (undefined4 *)local_438;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar29 = *(undefined4 *)pcVar25;
          pcVar25 = pcVar25 + (ulong)bVar38 * -8 + 4;
          puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
        }
        iStack_3c8 = *(int *)((long)&(pnVar22->m_backend).data + lVar37 + 0x70);
        bStack_3c4 = (bool)*(byte *)((long)&(pnVar22->m_backend).data + lVar37 + 0x74);
        uVar7 = *(undefined8 *)((long)&(pnVar22->m_backend).data + lVar37 + 0x78);
        local_3c0._0_4_ = (fpclass_type)uVar7;
        local_3c0._4_4_ = SUB84(uVar7,4);
        piVar18 = piVar17;
        if ((fpclass_type)uVar7 == cpp_dec_float_NaN) {
LAB_005bc319:
          pnVar26 = local_440;
          puVar24 = (uint *)local_4e8;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar24 = (pnVar26->m_backend).data._M_elems[0];
            pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar26 + (ulong)bVar38 * -8 + 4);
            puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
          }
          bStack_474 = (this->epsilon).m_backend.neg;
          iStack_478 = (this->epsilon).m_backend.exp;
          fVar4 = (this->epsilon).m_backend.fpclass;
          iVar9 = (this->epsilon).m_backend.prec_elem;
          local_470._0_4_ = fVar4;
          local_470._4_4_ = iVar9;
          if (local_4e8._0_4_ != 0 || fVar4 != cpp_dec_float_finite) {
            bStack_474 = (bool)(bStack_474 ^ 1);
          }
          if ((fVar4 != cpp_dec_float_NaN) && ((fpclass_type)local_3c0 != cpp_dec_float_NaN)) {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_438,
                                (cpp_dec_float<200U,_int,_void> *)local_4e8);
            if (-1 < iVar11) {
              pnVar26 = local_440;
              puVar24 = (uint *)local_3a8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar24 = (pnVar26->m_backend).data._M_elems[0];
                pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar26 + (ulong)bVar38 * -8 + 4);
                puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
              }
              iStack_338 = (this->epsilon).m_backend.exp;
              bStack_334 = (this->epsilon).m_backend.neg;
              fVar1 = (this->epsilon).m_backend.fpclass;
              iVar2 = (this->epsilon).m_backend.prec_elem;
              local_330._0_4_ = fVar1;
              local_330._4_4_ = iVar2;
              if ((fVar1 != cpp_dec_float_NaN && (fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_438,
                                      (cpp_dec_float<200U,_int,_void> *)local_3a8), iVar11 < 1)) {
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          (this_00,0.0);
                goto LAB_005bcb18;
              }
            }
          }
          piVar18 = piVar17 + 1;
          *piVar17 = (int)pcVar19;
          if (local_3ac == LEAVE) {
            pSVar5 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            if (this->iscoid == true) {
              pDVar14 = (pSVar5->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.costat;
            }
            else {
              pDVar14 = (pSVar5->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.stat;
            }
            if (0 < pSVar5->theRep * pDVar14->data[(long)pcVar19]) goto LAB_005bcb18;
          }
          local_450 = pcVar19;
          if ((char)local_310 != '\0') {
            pSVar5 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar6 = (pSVar5->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (0 < *(int *)((long)&(pSVar6->super_DataKey).info + lVar36)) {
              SPxColId::SPxColId((SPxColId *)local_4e8,
                                 (SPxId *)((long)&(pSVar6->super_DataKey).info + lVar36));
              iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(&(pSVar5->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set,(DataKey *)local_4e8);
              pcVar19 = local_450;
              if ((pSVar5->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[iVar11] == P_FIXED) goto LAB_005bcb18;
            }
          }
          pnVar26 = local_440;
          puVar24 = (uint *)local_4e8;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar24 = (pnVar26->m_backend).data._M_elems[0];
            pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar26 + (ulong)bVar38 * -8 + 4);
            puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
          }
          iVar11 = (this->epsilon).m_backend.exp;
          bVar34 = (this->epsilon).m_backend.neg;
          fVar16 = (this->epsilon).m_backend.fpclass;
          iVar35 = (this->epsilon).m_backend.prec_elem;
          local_470._0_4_ = (this->epsilon).m_backend.fpclass;
          local_470._4_4_ = (this->epsilon).m_backend.prec_elem;
          if (fVar16 == cpp_dec_float_NaN || (fpclass_type)local_3c0 == cpp_dec_float_NaN) {
LAB_005bc5da:
            pnVar26 = local_440;
            puVar24 = (uint *)local_4e8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar24 = (pnVar26->m_backend).data._M_elems[0];
              pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar26 + (ulong)bVar38 * -8 + 4);
              puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
            }
            iStack_478 = iVar11;
            bStack_474 = (bool)bVar34;
            local_470._4_4_ = iVar35;
            local_470._0_4_ = fVar16;
            if (local_4e8._0_4_ != 0 || fVar16 != cpp_dec_float_finite) {
              bStack_474 = (bool)(bVar34 ^ 1);
            }
            pcVar19 = local_450;
            if (((fVar16 == cpp_dec_float_NaN) || ((fpclass_type)local_3c0 == cpp_dec_float_NaN)) ||
               (local_458 = piVar18,
               iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_438,
                                   (cpp_dec_float<200U,_int,_void> *)local_4e8), piVar18 = local_458
               , pcVar19 = local_450, -1 < iVar11)) goto LAB_005bcb18;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
            puVar24 = (uint *)local_4e8;
            for (lVar13 = 0x1c; piVar18 = local_458, lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar24 = (pcVar30->data)._M_elems[0];
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar38 * -8 + 4);
              puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
            }
            iStack_478 = iStack_3c8;
            bStack_474 = bStack_3c4;
            local_470._0_4_ = (fpclass_type)local_3c0;
            local_470._4_4_ = local_3c0._4_4_;
            if (local_4e8._0_4_ != 0 || (fpclass_type)local_3c0 != cpp_dec_float_finite) {
              bStack_474 = (bool)(bStack_3c4 ^ 1);
            }
            fVar16 = local_280.fpclass;
            if (local_280.fpclass == cpp_dec_float_NaN ||
                (fpclass_type)local_3c0 == cpp_dec_float_NaN) {
LAB_005bc8e6:
              puVar24 = local_280.data._M_elems + 1;
              puVar21 = (uint *)local_3a8;
              for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar21 = *puVar24;
                puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
                puVar21 = puVar21 + (ulong)bVar38 * -2 + 1;
              }
              iVar11 = local_280.exp;
              bVar34 = local_280.neg;
              iVar35 = local_280.prec_elem;
            }
            else {
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_4e8,&local_280);
              if (iVar11 < 1) {
                fVar16 = local_280.fpclass;
                goto LAB_005bc8e6;
              }
              puVar29 = (undefined4 *)(local_438 + 4);
              puVar28 = (undefined4 *)local_3a8;
              for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar28 = *puVar29;
                puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
                puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
              }
              local_280.data._M_elems[0] = 0;
              iVar11 = iStack_3c8;
              iVar35 = local_3c0._4_4_;
              if ((fpclass_type)local_3c0 == cpp_dec_float_finite && local_438._0_4_ == 0) {
                fVar16 = cpp_dec_float_finite;
                bVar34 = bStack_3c4;
              }
              else {
                bVar34 = bStack_3c4 ^ 1;
                fVar16 = (fpclass_type)local_3c0;
                local_280.data._M_elems[0] = local_438._0_4_;
              }
            }
            puVar24 = (uint *)local_3a8;
            puVar21 = local_280.data._M_elems + 1;
            for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar21 = *puVar24;
              puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
              puVar21 = puVar21 + (ulong)bVar38 * -2 + 1;
            }
            local_280.prec_elem = iVar35;
            local_280.fpclass = fVar16;
            puVar29 = (undefined4 *)((long)local_320 + lVar37 + -0x78);
            puVar28 = puVar29;
            puVar33 = (undefined4 *)local_1b8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar33 = *puVar28;
              puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
              puVar33 = puVar33 + (ulong)bVar38 * -2 + 1;
            }
            iStack_148 = puVar29[0x1c];
            bStack_144 = *(bool *)(puVar29 + 0x1d);
            local_140 = *(undefined8 *)(puVar29 + 0x1e);
            local_280.exp = iVar11;
            local_280.neg = (bool)bVar34;
            ::soplex::infinity::__tls_init();
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            uStack_47b = 0;
            iStack_478 = 0;
            bStack_474 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4e8,local_1f8);
            pcVar19 = local_450;
            if ((((fpclass_type)local_140 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_470 == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_1b8,
                                    (cpp_dec_float<200U,_int,_void> *)local_4e8),
               pcVar19 = local_450, iVar11 < 1)) goto LAB_005bcb18;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3b8->m_backend + lVar37);
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            uStack_47b = 0;
            iStack_478 = 0;
            bStack_474 = false;
            if (pcVar30 == (cpp_dec_float<200U,_int,_void> *)local_4e8) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                         (cpp_dec_float<200U,_int,_void> *)local_1b8);
              if (local_4e8._0_4_ == 0 && (fpclass_type)local_470 == cpp_dec_float_finite) {
                local_290._0_4_ = cpp_dec_float_finite;
              }
              else {
                bStack_474 = (bool)(bStack_474 ^ 1);
                local_290._0_4_ = (fpclass_type)local_470;
              }
            }
            else {
              puVar29 = (undefined4 *)local_1b8;
              puVar28 = (undefined4 *)local_4e8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar28 = *puVar29;
                puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
                puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
              }
              iStack_478 = iStack_148;
              bStack_474 = bStack_144;
              local_470._0_4_ = (fpclass_type)local_140;
              local_470._4_4_ = local_140._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4e8,pcVar30);
              local_290._0_4_ = (fpclass_type)local_470;
            }
            puVar29 = (undefined4 *)local_4e8;
            puVar28 = (undefined4 *)local_308;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar28 = *puVar29;
              puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
              puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
            }
            iStack_298 = iStack_478;
            bStack_294 = bStack_474;
            local_290._4_4_ = local_470._4_4_;
            if ((fpclass_type)local_290 == cpp_dec_float_NaN) {
LAB_005bce48:
              local_330._0_4_ = cpp_dec_float_finite;
              local_330._4_4_ = 0x1c;
              local_3a8._0_16_ = (undefined1  [16])0x0;
              local_3a8._16_16_ = (undefined1  [16])0x0;
              local_388 = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = SUB1613((undefined1  [16])0x0,0);
              uStack_33b = 0;
              iStack_338 = 0;
              bStack_334 = false;
              if ((cpp_dec_float<200U,_int,_void> *)local_3a8 == local_448) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_3a8,
                           (cpp_dec_float<200U,_int,_void> *)local_308);
                if (local_3a8._0_4_ != 0 || (fpclass_type)local_330 != cpp_dec_float_finite) {
                  bStack_334 = (bool)(bStack_334 ^ 1);
                }
              }
              else {
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_308;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_3a8;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar23->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar38 * -8 + 4);
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar38 * -8 + 4);
                }
                iStack_338 = iStack_298;
                bStack_334 = bStack_294;
                local_330._0_4_ = (fpclass_type)local_290;
                local_330._4_4_ = local_290._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_3a8,local_448);
              }
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4e8,0,(type *)0x0);
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_308,
                                  (cpp_dec_float<200U,_int,_void> *)local_4e8);
              if (iVar11 < 0) goto LAB_005bce48;
              pcVar30 = local_448;
              puVar24 = (uint *)local_3a8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar24 = (pcVar30->data)._M_elems[0];
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar38 * -8 + 4)
                ;
                puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
              }
              iStack_338 = (this->fastDelta).m_backend.exp;
              bStack_334 = (this->fastDelta).m_backend.neg;
              local_330._0_4_ = (this->fastDelta).m_backend.fpclass;
              local_330._4_4_ = (this->fastDelta).m_backend.prec_elem;
              if ((fpclass_type)local_330 != cpp_dec_float_finite || local_3a8._0_4_ != 0) {
                bStack_334 = (bool)(bStack_334 ^ 1);
              }
            }
LAB_005bcf84:
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            bStack_474 = false;
            iStack_478 = 0;
            uStack_47b = 0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            local_498 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                       (cpp_dec_float<200U,_int,_void> *)local_3a8,
                       (cpp_dec_float<200U,_int,_void> *)local_438);
          }
          else {
            iStack_478 = iVar11;
            bStack_474 = (bool)bVar34;
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_438,
                                (cpp_dec_float<200U,_int,_void> *)local_4e8);
            if (iVar11 < 1) {
              iVar11 = (this->epsilon).m_backend.exp;
              bVar34 = (this->epsilon).m_backend.neg;
              fVar16 = (this->epsilon).m_backend.fpclass;
              iVar35 = (this->epsilon).m_backend.prec_elem;
              goto LAB_005bc5da;
            }
            piVar15 = &local_280.prec_elem;
            fVar16 = local_280.fpclass;
            if (local_280.fpclass != cpp_dec_float_NaN &&
                (fpclass_type)local_3c0 != cpp_dec_float_NaN) {
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_438,&local_280);
              if (iVar11 < 1) {
                piVar15 = &local_280.prec_elem;
                fVar16 = local_280.fpclass;
              }
              else {
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
                pcVar23 = &local_280;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar23->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar38 * -8 + 4);
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + ((ulong)bVar38 * -2 + 1) * 4);
                }
                local_280.exp = iStack_3c8;
                local_280.neg = bStack_3c4;
                piVar15 = (int32_t *)((long)&local_3c0 + 4);
                fVar16 = (fpclass_type)local_3c0;
              }
            }
            local_280.fpclass = fVar16;
            local_280.prec_elem = *piVar15;
            puVar12 = (undefined8 *)((long)local_318 + lVar37);
            puVar27 = puVar12 + -0xf;
            puVar29 = (undefined4 *)local_138;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar29 = *(undefined4 *)puVar27;
              puVar27 = (undefined8 *)((long)puVar27 + (ulong)bVar38 * -8 + 4);
              puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
            }
            iStack_c8 = *(int *)(puVar12 + -1);
            bStack_c4 = *(bool *)((long)puVar12 + -4);
            local_c0 = *puVar12;
            ::soplex::infinity::__tls_init();
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            uStack_47b = 0;
            iStack_478 = 0;
            bStack_474 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4e8,local_1e8);
            pcVar19 = local_450;
            if ((((fpclass_type)local_c0 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_470 == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_138,
                                    (cpp_dec_float<200U,_int,_void> *)local_4e8),
               pcVar19 = local_450, -1 < iVar11)) goto LAB_005bcb18;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3b8->m_backend + lVar37);
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            uStack_47b = 0;
            iStack_478 = 0;
            bStack_474 = false;
            if (pcVar30 == (cpp_dec_float<200U,_int,_void> *)local_4e8) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4e8,
                         (cpp_dec_float<200U,_int,_void> *)local_138);
              if (local_4e8._0_4_ == 0 && (fpclass_type)local_470 == cpp_dec_float_finite) {
                local_290._0_4_ = cpp_dec_float_finite;
              }
              else {
                bStack_474 = (bool)(bStack_474 ^ 1);
                local_290._0_4_ = (fpclass_type)local_470;
              }
            }
            else {
              puVar29 = (undefined4 *)local_138;
              puVar28 = (undefined4 *)local_4e8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar28 = *puVar29;
                puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
                puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
              }
              iStack_478 = iStack_c8;
              bStack_474 = bStack_c4;
              local_470._0_4_ = (fpclass_type)local_c0;
              local_470._4_4_ = local_c0._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4e8,pcVar30);
              local_290._0_4_ = (fpclass_type)local_470;
            }
            puVar29 = (undefined4 *)local_4e8;
            puVar28 = (undefined4 *)local_308;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar28 = *puVar29;
              puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
              puVar28 = puVar28 + (ulong)bVar38 * -2 + 1;
            }
            iStack_298 = iStack_478;
            bStack_294 = bStack_474;
            local_290._4_4_ = local_470._4_4_;
            local_458 = piVar18;
            if ((fpclass_type)local_290 == cpp_dec_float_NaN) {
LAB_005bcbf6:
              local_330._0_4_ = cpp_dec_float_finite;
              local_330._4_4_ = 0x1c;
              local_3a8._0_16_ = (undefined1  [16])0x0;
              local_3a8._16_16_ = (undefined1  [16])0x0;
              local_388 = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = SUB1613((undefined1  [16])0x0,0);
              uStack_33b = 0;
              iStack_338 = 0;
              bStack_334 = false;
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_308;
              if ((cpp_dec_float<200U,_int,_void> *)local_3a8 != local_448) {
                puVar24 = (uint *)local_3a8;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  *puVar24 = (pcVar30->data)._M_elems[0];
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar38 * -8 + 4);
                  puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
                }
                iStack_338 = iStack_298;
                bStack_334 = bStack_294;
                local_330._0_4_ = (fpclass_type)local_290;
                local_330._4_4_ = local_290._4_4_;
                pcVar30 = local_448;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_3a8,pcVar30);
              goto LAB_005bcf84;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4e8,0,(type *)0x0);
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_308,
                                (cpp_dec_float<200U,_int,_void> *)local_4e8);
            if (0 < iVar11) goto LAB_005bcbf6;
            local_470._0_4_ = cpp_dec_float_finite;
            local_470._4_4_ = 0x1c;
            local_4e8._0_16_ = (undefined1  [16])0x0;
            local_4e8._16_16_ = (undefined1  [16])0x0;
            local_4c8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = SUB1613((undefined1  [16])0x0,0);
            uStack_47b = 0;
            iStack_478 = 0;
            bStack_474 = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_4e8,local_448,
                       (cpp_dec_float<200U,_int,_void> *)local_438);
          }
          pcVar19 = local_450;
          puVar24 = (uint *)local_4e8;
          pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar30->data)._M_elems[0] = *puVar24;
            puVar24 = puVar24 + (ulong)bVar38 * -2 + 1;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar38 * -8 + 4);
          }
          iStack_3c8 = iStack_478;
          bStack_3c4 = bStack_474;
          local_3c0._0_4_ = (fpclass_type)local_470;
          local_3c0._4_4_ = local_470._4_4_;
          piVar18 = local_458;
          if ((((fpclass_type)local_470 != cpp_dec_float_NaN) &&
              (local_b0.fpclass != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_438,&local_b0),
             piVar18 = local_458, iVar11 < 0)) {
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_438;
            pcVar23 = &local_b0;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar38 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar38 * -8 + 4);
            }
            local_b0.exp = iStack_3c8;
            local_b0.neg = bStack_3c4;
            local_b0.fpclass = (fpclass_type)local_3c0;
            local_b0.prec_elem = local_3c0._4_4_;
            local_45c = (int)pcVar19;
          }
        }
        else {
          local_470._0_4_ = cpp_dec_float_finite;
          local_470._4_4_ = 0x1c;
          local_4e8._0_16_ = (undefined1  [16])0x0;
          local_4e8._16_16_ = (undefined1  [16])0x0;
          local_4c8 = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = SUB1613((undefined1  [16])0x0,0);
          uStack_47b = 0;
          iStack_478 = 0;
          bStack_474 = false;
          local_450 = this_00;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4e8,0.0);
          this_00 = local_450;
          iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_438,
                              (cpp_dec_float<200U,_int,_void> *)local_4e8);
          if (iVar11 != 0) goto LAB_005bc319;
        }
LAB_005bcb18:
        pcVar19 = pcVar19 + 1;
        lVar36 = lVar36 + 8;
        pnVar22 = (pointer)((long)&local_200[1].m_backend.data + lVar37);
        lVar37 = lVar37 + 0x80;
        piVar17 = piVar18;
      } while (pnVar22 < local_328);
      piVar17 = (local_1d0->thedelta).super_IdxSet.idx;
    }
    (local_1d0->thedelta).super_IdxSet.num = (int)((ulong)((long)piVar18 - (long)piVar17) >> 2);
    (local_1d0->thedelta).setupStatus = true;
  }
  pcVar30 = &local_b0;
  pnVar26 = local_1c8;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar30->data)._M_elems[0];
    pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + ((ulong)bVar38 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar38 * -2 + 1) * 4);
  }
  (local_1c8->m_backend).exp = local_b0.exp;
  (local_1c8->m_backend).neg = local_b0.neg;
  (local_1c8->m_backend).fpclass = local_b0.fpclass;
  (local_1c8->m_backend).prec_elem = local_b0.prec_elem;
  pcVar30 = &local_280;
  pnVar26 = local_1c0;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar30->data)._M_elems[0];
    pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + ((ulong)bVar38 * -2 + 1) * 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar38 * -2 + 1) * 4);
  }
  (local_1c0->m_backend).exp = local_280.exp;
  (local_1c0->m_backend).neg = local_280.neg;
  (local_1c0->m_backend).fpclass = local_280.fpclass;
  (local_1c0->m_backend).prec_elem = local_280.prec_elem;
  return local_45c;
}

Assistant:

int SPxFastRT<R>::maxDelta(
   R& val,                                /* on return: maximum step length */
   R& maxabs,                             /* on return: maximum absolute value in upd VectorBase<R> */
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         x = upd[i];

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse Vector update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;

            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;
   return sel;
}